

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

void duckdb::RangeTableFunction::RegisterFunction(BuiltinFunctions *set)

{
  vector<duckdb::TableFunction,_true> *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  vector<duckdb::LogicalType,_true> *pvVar3;
  long lVar4;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  initializer_list<duckdb::LogicalType> __l_05;
  initializer_list<duckdb::LogicalType> __l_06;
  allocator_type local_1491;
  LogicalType local_1490 [3];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1448;
  string local_1430;
  string local_1410;
  TableFunctionSet generate_series;
  TableFunctionSet range;
  TableFunction generate_series_in_out;
  FunctionSet<duckdb::TableFunction> local_11c8;
  FunctionSet<duckdb::TableFunction> local_1190;
  TableFunction range_in_out;
  TableFunction range_function;
  TableFunction local_de8;
  TableFunction local_c30;
  TableFunction local_a78;
  TableFunction local_8c0;
  TableFunction local_708;
  TableFunction local_550;
  TableFunction local_398;
  TableFunction local_1e0;
  
  ::std::__cxx11::string::string((string *)&local_1410,"range",(allocator *)&range_function);
  TableFunctionSet::TableFunctionSet(&range,&local_1410);
  ::std::__cxx11::string::~string((string *)&local_1410);
  LogicalType::LogicalType((LogicalType *)&generate_series_in_out,BIGINT);
  __l._M_len = 1;
  __l._M_array = (iterator)&generate_series_in_out;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&range_in_out,__l,
             (allocator_type *)local_1490);
  TableFunction::TableFunction
            (&range_function,(vector<duckdb::LogicalType,_true> *)&range_in_out,
             (table_function_t)0x0,RangeFunctionBind<false>,(table_function_init_global_t)0x0,
             RangeFunctionLocalInit);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&range_in_out);
  LogicalType::~LogicalType((LogicalType *)&generate_series_in_out);
  range_function.in_out_function = RangeFunction<false>;
  range_function.cardinality = RangeCardinality;
  TableFunction::TableFunction(&local_1e0,&range_function);
  pvVar1 = &range.super_FunctionSet<duckdb::TableFunction>.functions;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&pvVar1->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_1e0);
  TableFunction::~TableFunction(&local_1e0);
  LogicalType::LogicalType((LogicalType *)&range_in_out,BIGINT);
  paVar2 = &range_in_out.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.name
            .field_2;
  LogicalType::LogicalType((LogicalType *)paVar2,BIGINT);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&range_in_out;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &generate_series_in_out,__l_00,(allocator_type *)local_1490);
  pvVar3 = &range_function.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&pvVar3->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &generate_series_in_out);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &generate_series_in_out);
  lVar4 = 0x18;
  do {
    LogicalType::~LogicalType
              ((LogicalType *)
               ((long)&range_in_out.super_SimpleNamedParameterFunction.super_SimpleFunction.
                       super_Function._vptr_Function + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  TableFunction::TableFunction(&local_398,&range_function);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&pvVar1->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_398);
  TableFunction::~TableFunction(&local_398);
  LogicalType::LogicalType((LogicalType *)&range_in_out,BIGINT);
  LogicalType::LogicalType((LogicalType *)paVar2,BIGINT);
  LogicalType::LogicalType
            ((LogicalType *)
             &range_in_out.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.
              extra_info._M_string_length,BIGINT);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&range_in_out;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &generate_series_in_out,__l_01,(allocator_type *)local_1490);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&pvVar3->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &generate_series_in_out);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &generate_series_in_out);
  lVar4 = 0x30;
  do {
    LogicalType::~LogicalType
              ((LogicalType *)
               ((long)&range_in_out.super_SimpleNamedParameterFunction.super_SimpleFunction.
                       super_Function._vptr_Function + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  TableFunction::TableFunction(&local_550,&range_function);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&pvVar1->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_550);
  TableFunction::~TableFunction(&local_550);
  LogicalType::LogicalType((LogicalType *)&generate_series_in_out,TIMESTAMP);
  LogicalType::LogicalType
            ((LogicalType *)
             &generate_series_in_out.super_SimpleNamedParameterFunction.super_SimpleFunction.
              super_Function.name.field_2,TIMESTAMP);
  LogicalType::LogicalType
            ((LogicalType *)
             &generate_series_in_out.super_SimpleNamedParameterFunction.super_SimpleFunction.
              super_Function.extra_info._M_string_length,INTERVAL);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&generate_series_in_out;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1490,__l_02,
             (allocator_type *)&generate_series);
  TableFunction::TableFunction
            (&range_in_out,(vector<duckdb::LogicalType,_true> *)local_1490,(table_function_t)0x0,
             RangeDateTimeBind<false>,(table_function_init_global_t)0x0,RangeDateTimeLocalInit);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1490);
  lVar4 = 0x30;
  do {
    LogicalType::~LogicalType
              ((LogicalType *)
               ((long)&generate_series_in_out.super_SimpleNamedParameterFunction.
                       super_SimpleFunction.super_Function._vptr_Function + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  range_in_out.in_out_function = RangeDateTimeFunction<false>;
  TableFunction::TableFunction(&local_708,&range_in_out);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&pvVar1->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_708);
  TableFunction::~TableFunction(&local_708);
  FunctionSet<duckdb::TableFunction>::FunctionSet
            (&local_1190,&range.super_FunctionSet<duckdb::TableFunction>);
  BuiltinFunctions::AddFunction(set,(TableFunctionSet *)&local_1190);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_1190);
  ::std::__cxx11::string::string
            ((string *)&local_1430,"generate_series",(allocator *)&generate_series_in_out);
  TableFunctionSet::TableFunctionSet(&generate_series,&local_1430);
  ::std::__cxx11::string::~string((string *)&local_1430);
  range_function.bind = RangeFunctionBind<true>;
  range_function.in_out_function = RangeFunction<true>;
  LogicalType::LogicalType(local_1490,BIGINT);
  __l_03._M_len = 1;
  __l_03._M_array = local_1490;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &generate_series_in_out,__l_03,(allocator_type *)&local_1448);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&pvVar3->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &generate_series_in_out);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &generate_series_in_out);
  LogicalType::~LogicalType(local_1490);
  TableFunction::TableFunction(&local_8c0,&range_function);
  pvVar1 = &generate_series.super_FunctionSet<duckdb::TableFunction>.functions;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&pvVar1->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_8c0);
  TableFunction::~TableFunction(&local_8c0);
  LogicalType::LogicalType((LogicalType *)&generate_series_in_out,BIGINT);
  paVar2 = &generate_series_in_out.super_SimpleNamedParameterFunction.super_SimpleFunction.
            super_Function.name.field_2;
  LogicalType::LogicalType((LogicalType *)paVar2,BIGINT);
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&generate_series_in_out;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1490,__l_04,
             (allocator_type *)&local_1448);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&pvVar3->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             local_1490);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1490);
  lVar4 = 0x18;
  do {
    LogicalType::~LogicalType
              ((LogicalType *)
               ((long)&generate_series_in_out.super_SimpleNamedParameterFunction.
                       super_SimpleFunction.super_Function._vptr_Function + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  TableFunction::TableFunction(&local_a78,&range_function);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&pvVar1->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_a78);
  TableFunction::~TableFunction(&local_a78);
  LogicalType::LogicalType((LogicalType *)&generate_series_in_out,BIGINT);
  LogicalType::LogicalType((LogicalType *)paVar2,BIGINT);
  LogicalType::LogicalType
            ((LogicalType *)
             &generate_series_in_out.super_SimpleNamedParameterFunction.super_SimpleFunction.
              super_Function.extra_info._M_string_length,BIGINT);
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)&generate_series_in_out;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1490,__l_05,
             (allocator_type *)&local_1448);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&pvVar3->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             local_1490);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1490);
  lVar4 = 0x30;
  do {
    LogicalType::~LogicalType
              ((LogicalType *)
               ((long)&generate_series_in_out.super_SimpleNamedParameterFunction.
                       super_SimpleFunction.super_Function._vptr_Function + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  TableFunction::TableFunction(&local_c30,&range_function);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&pvVar1->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_c30);
  TableFunction::~TableFunction(&local_c30);
  LogicalType::LogicalType(local_1490,TIMESTAMP);
  LogicalType::LogicalType(local_1490 + 1,TIMESTAMP);
  LogicalType::LogicalType(local_1490 + 2,INTERVAL);
  __l_06._M_len = 3;
  __l_06._M_array = local_1490;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_1448,__l_06,&local_1491);
  TableFunction::TableFunction
            (&generate_series_in_out,(vector<duckdb::LogicalType,_true> *)&local_1448,
             (table_function_t)0x0,RangeDateTimeBind<true>,(table_function_init_global_t)0x0,
             RangeDateTimeLocalInit);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1448);
  lVar4 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_1490[0].id_ + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  generate_series_in_out.in_out_function = RangeDateTimeFunction<true>;
  TableFunction::TableFunction(&local_de8,&generate_series_in_out);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&pvVar1->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_de8);
  TableFunction::~TableFunction(&local_de8);
  FunctionSet<duckdb::TableFunction>::FunctionSet
            (&local_11c8,&generate_series.super_FunctionSet<duckdb::TableFunction>);
  BuiltinFunctions::AddFunction(set,(TableFunctionSet *)&local_11c8);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_11c8);
  TableFunction::~TableFunction(&generate_series_in_out);
  FunctionSet<duckdb::TableFunction>::~FunctionSet
            (&generate_series.super_FunctionSet<duckdb::TableFunction>);
  TableFunction::~TableFunction(&range_in_out);
  TableFunction::~TableFunction(&range_function);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&range.super_FunctionSet<duckdb::TableFunction>);
  return;
}

Assistant:

void RangeTableFunction::RegisterFunction(BuiltinFunctions &set) {
	TableFunctionSet range("range");

	TableFunction range_function({LogicalType::BIGINT}, nullptr, RangeFunctionBind<false>, nullptr,
	                             RangeFunctionLocalInit);
	range_function.in_out_function = RangeFunction<false>;
	range_function.cardinality = RangeCardinality;

	// single argument range: (end) - implicit start = 0 and increment = 1
	range.AddFunction(range_function);
	// two arguments range: (start, end) - implicit increment = 1
	range_function.arguments = {LogicalType::BIGINT, LogicalType::BIGINT};
	range.AddFunction(range_function);
	// three arguments range: (start, end, increment)
	range_function.arguments = {LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BIGINT};
	range.AddFunction(range_function);
	TableFunction range_in_out({LogicalType::TIMESTAMP, LogicalType::TIMESTAMP, LogicalType::INTERVAL}, nullptr,
	                           RangeDateTimeBind<false>, nullptr, RangeDateTimeLocalInit);
	range_in_out.in_out_function = RangeDateTimeFunction<false>;
	range.AddFunction(range_in_out);
	set.AddFunction(range);
	// generate_series: similar to range, but inclusive instead of exclusive bounds on the RHS
	TableFunctionSet generate_series("generate_series");
	range_function.bind = RangeFunctionBind<true>;
	range_function.in_out_function = RangeFunction<true>;
	range_function.arguments = {LogicalType::BIGINT};
	generate_series.AddFunction(range_function);
	range_function.arguments = {LogicalType::BIGINT, LogicalType::BIGINT};
	generate_series.AddFunction(range_function);
	range_function.arguments = {LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BIGINT};
	generate_series.AddFunction(range_function);
	TableFunction generate_series_in_out({LogicalType::TIMESTAMP, LogicalType::TIMESTAMP, LogicalType::INTERVAL},
	                                     nullptr, RangeDateTimeBind<true>, nullptr, RangeDateTimeLocalInit);
	generate_series_in_out.in_out_function = RangeDateTimeFunction<true>;
	generate_series.AddFunction(generate_series_in_out);
	set.AddFunction(generate_series);
}